

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_view_relation.cpp
# Opt level: O1

void __thiscall
duckdb::CreateViewRelation::CreateViewRelation
          (CreateViewRelation *this,shared_ptr<duckdb::Relation,_true> *child_p,
          string *schema_name_p,string *view_name_p,bool replace_p,bool temporary_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  Relation *pRVar7;
  string local_50;
  
  pRVar7 = shared_ptr<duckdb::Relation,_true>::operator->(child_p);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,anon_var_dwarf_643533f + 9);
  Relation::Relation(&this->super_Relation,&pRVar7->context,CREATE_VIEW_RELATION,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__CreateViewRelation_019c9710;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  paVar1 = &(this->schema_name).field_2;
  (this->schema_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (schema_name_p->_M_dataplus)._M_p;
  paVar2 = &schema_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&schema_name_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->schema_name).field_2 + 8) = uVar6;
  }
  else {
    (this->schema_name)._M_dataplus._M_p = pcVar3;
    (this->schema_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->schema_name)._M_string_length = schema_name_p->_M_string_length;
  (schema_name_p->_M_dataplus)._M_p = (pointer)paVar2;
  schema_name_p->_M_string_length = 0;
  (schema_name_p->field_2)._M_local_buf[0] = '\0';
  paVar2 = &(this->view_name).field_2;
  (this->view_name)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (view_name_p->_M_dataplus)._M_p;
  paVar1 = &view_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar6 = *(undefined8 *)((long)&view_name_p->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->view_name).field_2 + 8) = uVar6;
  }
  else {
    (this->view_name)._M_dataplus._M_p = pcVar3;
    (this->view_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->view_name)._M_string_length = view_name_p->_M_string_length;
  (view_name_p->_M_dataplus)._M_p = (pointer)paVar1;
  view_name_p->_M_string_length = 0;
  (view_name_p->field_2)._M_local_buf[0] = '\0';
  this->replace = replace_p;
  this->temporary = temporary_p;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Relation::TryBindRelation(&this->super_Relation,&this->columns);
  return;
}

Assistant:

CreateViewRelation::CreateViewRelation(shared_ptr<Relation> child_p, string schema_name_p, string view_name_p,
                                       bool replace_p, bool temporary_p)
    : Relation(child_p->context, RelationType::CREATE_VIEW_RELATION), child(std::move(child_p)),
      schema_name(std::move(schema_name_p)), view_name(std::move(view_name_p)), replace(replace_p),
      temporary(temporary_p) {
	TryBindRelation(columns);
}